

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3acc_io.c
# Opt level: O0

int rdacc_tmat(char *dir,float32 ****inout_tmat_acc,uint32 *inout_n_tmat,uint32 *inout_n_state_pm)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  uint local_1050;
  int err;
  uint32 n_state_pm;
  uint32 n_tmat;
  float32 ***tmat_acc;
  float32 ***in_tmat_acc;
  char fn [4097];
  uint32 *inout_n_state_pm_local;
  uint32 *inout_n_tmat_local;
  float32 ****inout_tmat_acc_local;
  char *dir_local;
  
  unique0x100000e8 = inout_n_state_pm;
  sprintf((char *)&in_tmat_acc,"%s/tmat_counts",dir);
  iVar1 = s3tmat_read((char *)&in_tmat_acc,&tmat_acc,(uint32 *)&err,&local_1050);
  if (iVar1 == 0) {
    _n_state_pm = *inout_tmat_acc;
    if (_n_state_pm == (float32 ***)0x0) {
      *inout_tmat_acc = tmat_acc;
      *inout_n_tmat = err;
      *stack0xffffffffffffffd0 = local_1050;
    }
    else {
      bVar2 = *inout_n_tmat != err;
      if (bVar2) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                ,0x60,"# tmat in, %u != prior # tmat, %u\n",(ulong)(uint)err,(ulong)*inout_n_tmat);
      }
      bVar3 = *stack0xffffffffffffffd0 != local_1050;
      if (bVar3) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                ,0x65,"# tmat in, %u != prior # tmat, %u\n",(ulong)local_1050,
                (ulong)*stack0xffffffffffffffd0);
      }
      if (bVar3 || bVar2) {
        return -1;
      }
      accum_3d(_n_state_pm,tmat_acc,err,local_1050 - 1,local_1050);
      ckd_free_3d(tmat_acc);
    }
    dir_local._4_4_ = 0;
  }
  else {
    dir_local._4_4_ = -1;
  }
  return dir_local._4_4_;
}

Assistant:

int
rdacc_tmat(const char *dir,
           float32 **** inout_tmat_acc,
           uint32 * inout_n_tmat, uint32 * inout_n_state_pm)
{
    char fn[MAXPATHLEN + 1];
    float32 ***in_tmat_acc;
    float32 ***tmat_acc;
    uint32 n_tmat;
    uint32 n_state_pm;

    sprintf(fn, "%s/tmat_counts", dir);

    if (s3tmat_read(fn,
                    &in_tmat_acc,
                    &n_tmat, &n_state_pm) != S3_SUCCESS) {
        return S3_ERROR;
    }
    tmat_acc = *inout_tmat_acc;

    if (tmat_acc == NULL) {
        *inout_tmat_acc = tmat_acc = in_tmat_acc;
        *inout_n_tmat = n_tmat;
        *inout_n_state_pm = n_state_pm;
    }
    else {
        int err = FALSE;

        if (*inout_n_tmat != n_tmat) {
            E_ERROR("# tmat in, %u != prior # tmat, %u\n",
                    n_tmat, *inout_n_tmat);
            err = TRUE;
        }
        if (*inout_n_state_pm != n_state_pm) {
            E_ERROR("# tmat in, %u != prior # tmat, %u\n",
                    n_state_pm, *inout_n_state_pm);
            err = TRUE;
        }

        if (err)
            return S3_ERROR;

        accum_3d(tmat_acc, in_tmat_acc,
                 n_tmat, n_state_pm - 1, n_state_pm);

        ckd_free_3d((void ***) in_tmat_acc);
    }

    return S3_SUCCESS;
}